

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_filename.c
# Opt level: O0

void test_read_format_cpio_filename(void)

{
  char *refname5;
  char *refname4;
  char *refname3;
  char *refname2;
  char *refname1;
  char *in_stack_000003f0;
  char *refname;
  
  refname = "test_read_format_cpio_filename_utf8_jp.cpio";
  extract_reference_file(in_stack_000003f0);
  test_read_format_cpio_filename_eucJP_UTF8(refname);
  test_read_format_cpio_filename_eucJP_CP932(refname);
  extract_reference_file(in_stack_000003f0);
  test_read_format_cpio_filename_UTF8_eucJP(refname);
  test_read_format_cpio_filename_UTF8_UTF8_jp(refname);
  test_read_format_cpio_filename_UTF8_CP932(refname);
  extract_reference_file(in_stack_000003f0);
  test_read_format_cpio_filename_CP866_KOI8R(refname);
  test_read_format_cpio_filename_CP866_UTF8(refname);
  test_read_format_cpio_filename_CP866_CP1251(refname);
  test_read_format_cpio_filename_CP866_CP1251_win(refname);
  extract_reference_file(in_stack_000003f0);
  test_read_format_cpio_filename_KOI8R_CP866(refname);
  test_read_format_cpio_filename_KOI8R_UTF8(refname);
  test_read_format_cpio_filename_KOI8R_CP1251(refname);
  extract_reference_file(in_stack_000003f0);
  test_read_format_cpio_filename_UTF8_KOI8R(refname);
  test_read_format_cpio_filename_UTF8_CP866(refname);
  test_read_format_cpio_filename_UTF8_UTF8_ru(refname);
  test_read_format_cpio_filename_UTF8_CP1251(refname);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_filename)
{
	const char *refname1 = "test_read_format_cpio_filename_eucjp.cpio";
	const char *refname2 = "test_read_format_cpio_filename_utf8_jp.cpio";
	const char *refname3 = "test_read_format_cpio_filename_cp866.cpio";
	const char *refname4 = "test_read_format_cpio_filename_koi8r.cpio";
	const char *refname5 = "test_read_format_cpio_filename_utf8_ru.cpio";

	extract_reference_file(refname1);
	test_read_format_cpio_filename_eucJP_UTF8(refname1);
	test_read_format_cpio_filename_eucJP_CP932(refname1);

	extract_reference_file(refname2);
	test_read_format_cpio_filename_UTF8_eucJP(refname2);
	test_read_format_cpio_filename_UTF8_UTF8_jp(refname2);
	test_read_format_cpio_filename_UTF8_CP932(refname2);

	extract_reference_file(refname3);
	test_read_format_cpio_filename_CP866_KOI8R(refname3);
	test_read_format_cpio_filename_CP866_UTF8(refname3);
	test_read_format_cpio_filename_CP866_CP1251(refname3);
	test_read_format_cpio_filename_CP866_CP1251_win(refname3);

	extract_reference_file(refname4);
	test_read_format_cpio_filename_KOI8R_CP866(refname4);
	test_read_format_cpio_filename_KOI8R_UTF8(refname4);
	test_read_format_cpio_filename_KOI8R_CP1251(refname4);

	extract_reference_file(refname5);
	test_read_format_cpio_filename_UTF8_KOI8R(refname5);
	test_read_format_cpio_filename_UTF8_CP866(refname5);
	test_read_format_cpio_filename_UTF8_UTF8_ru(refname5);
	test_read_format_cpio_filename_UTF8_CP1251(refname5);
}